

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O3

char * mp_encode_uint(char *data,uint64_t num)

{
  long lVar1;
  uint uVar2;
  
  if (num < 0x80) {
    *data = (char)num;
    lVar1 = 1;
  }
  else if (num < 0x100) {
    *data = -0x34;
    data[1] = (char)num;
    lVar1 = 2;
  }
  else if (num < 0x10000) {
    *data = -0x33;
    *(ushort *)(data + 1) = (ushort)num << 8 | (ushort)num >> 8;
    lVar1 = 3;
  }
  else if (num >> 0x20 == 0) {
    *data = -0x32;
    uVar2 = (uint)num;
    *(uint *)(data + 1) =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    lVar1 = 5;
  }
  else {
    *data = -0x31;
    *(uint64_t *)(data + 1) =
         num >> 0x38 | (num & 0xff000000000000) >> 0x28 | (num & 0xff0000000000) >> 0x18 |
         (num & 0xff00000000) >> 8 | (num & 0xff000000) << 8 | (num & 0xff0000) << 0x18 |
         (num & 0xff00) << 0x28 | num << 0x38;
    lVar1 = 9;
  }
  return data + lVar1;
}

Assistant:

MP_IMPL char *
mp_encode_uint(char *data, uint64_t num)
{
	if (num <= 0x7f) {
		return mp_store_u8(data, (uint8_t)num);
	} else if (num <= UINT8_MAX) {
		data = mp_store_u8(data, 0xcc);
		return mp_store_u8(data, (uint8_t)num);
	} else if (num <= UINT16_MAX) {
		data = mp_store_u8(data, 0xcd);
		return mp_store_u16(data, (uint16_t)num);
	} else if (num <= UINT32_MAX) {
		data = mp_store_u8(data, 0xce);
		return mp_store_u32(data, (uint32_t)num);
	} else {
		data = mp_store_u8(data, 0xcf);
		return mp_store_u64(data, num);
	}
}